

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderResourcesGL::GLResourceAttribs::GLResourceAttribs
          (GLResourceAttribs *this,GLResourceAttribs *Attribs,StringPool *NamesPool)

{
  Char *_Name;
  
  _Name = StringPool::CopyString(NamesPool,Attribs->Name);
  GLResourceAttribs(this,_Name,Attribs->ShaderStages,Attribs->ResourceType,Attribs->ResourceFlags,
                    Attribs->ArraySize);
  return;
}

Assistant:

GLResourceAttribs(const GLResourceAttribs& Attribs,
                          StringPool&              NamesPool) noexcept :
            // clang-format off
            GLResourceAttribs
            {
                NamesPool.CopyString(Attribs.Name),
                Attribs.ShaderStages,
                Attribs.ResourceType,
                Attribs.ResourceFlags,
                Attribs.ArraySize
            }
        // clang-format on
        {
        }